

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_getdefaultdelegate(HSQUIRRELVM v,SQObjectType t)

{
  SQVM *this;
  SQRESULT SVar1;
  int in_ESI;
  long in_RDI;
  SQSharedState *ss;
  undefined4 in_stack_ffffffffffffffd8;
  
  this = *(SQVM **)(in_RDI + 0x118);
  if ((in_ESI == 0x5000002) || (in_ESI == 0x5000004)) {
    SQVM::Push(this,(SQObjectPtr *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8));
  }
  else if (in_ESI == 0x8000010) {
    SQVM::Push(this,(SQObjectPtr *)CONCAT44(0x8000010,in_stack_ffffffffffffffd8));
  }
  else if (in_ESI == 0x8000040) {
    SQVM::Push(this,(SQObjectPtr *)CONCAT44(0x8000040,in_stack_ffffffffffffffd8));
  }
  else if ((in_ESI == 0x8000100) || (in_ESI == 0x8000200)) {
    SQVM::Push(this,(SQObjectPtr *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8));
  }
  else if (in_ESI == 0x8000400) {
    SQVM::Push(this,(SQObjectPtr *)CONCAT44(0x8000400,in_stack_ffffffffffffffd8));
  }
  else if (in_ESI == 0x8001000) {
    SQVM::Push(this,(SQObjectPtr *)CONCAT44(0x8001000,in_stack_ffffffffffffffd8));
  }
  else if (in_ESI == 0x8004000) {
    SQVM::Push(this,(SQObjectPtr *)CONCAT44(0x8004000,in_stack_ffffffffffffffd8));
  }
  else if (in_ESI == 0x8010000) {
    SQVM::Push(this,(SQObjectPtr *)CONCAT44(0x8010000,in_stack_ffffffffffffffd8));
  }
  else if (in_ESI == 0xa000020) {
    SQVM::Push(this,(SQObjectPtr *)CONCAT44(0xa000020,in_stack_ffffffffffffffd8));
  }
  else {
    if (in_ESI != 0xa008000) {
      SVar1 = sq_throwerror(this,(SQChar *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8));
      return SVar1;
    }
    SQVM::Push(this,(SQObjectPtr *)CONCAT44(0xa008000,in_stack_ffffffffffffffd8));
  }
  return 0;
}

Assistant:

SQRESULT sq_getdefaultdelegate(HSQUIRRELVM v,SQObjectType t)
{
    SQSharedState *ss = _ss(v);
    switch(t) {
    case OT_TABLE: v->Push(ss->_table_default_delegate); break;
    case OT_ARRAY: v->Push(ss->_array_default_delegate); break;
    case OT_STRING: v->Push(ss->_string_default_delegate); break;
    case OT_INTEGER: case OT_FLOAT: v->Push(ss->_number_default_delegate); break;
    case OT_GENERATOR: v->Push(ss->_generator_default_delegate); break;
    case OT_CLOSURE: case OT_NATIVECLOSURE: v->Push(ss->_closure_default_delegate); break;
    case OT_THREAD: v->Push(ss->_thread_default_delegate); break;
    case OT_CLASS: v->Push(ss->_class_default_delegate); break;
    case OT_INSTANCE: v->Push(ss->_instance_default_delegate); break;
    case OT_WEAKREF: v->Push(ss->_weakref_default_delegate); break;
    default: return sq_throwerror(v,_SC("the type doesn't have a default delegate"));
    }
    return SQ_OK;
}